

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdShift<long,long>(Thread *this,BinopFunc<long,_long> *f)

{
  Simd<long,_(unsigned_char)__x02_> value;
  uint uVar1;
  long *plVar2;
  long lVar3;
  byte local_41;
  undefined1 auStack_40 [7];
  u8 i;
  SR result;
  Simd<long,_(unsigned_char)__x02_> lhs;
  uint amount;
  BinopFunc<long,_long> *f_local;
  Thread *this_local;
  
  uVar1 = Pop<unsigned_int>(this);
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<long,(unsigned_char)2>>(this);
  for (local_41 = 0; local_41 < 2; local_41 = local_41 + 1) {
    plVar2 = Simd<long,_(unsigned_char)'\x02'>::operator[]
                       ((Simd<long,_(unsigned_char)__x02_> *)(result.v + 1),local_41);
    lVar3 = (*f)(*plVar2,(long)uVar1);
    plVar2 = Simd<long,_(unsigned_char)'\x02'>::operator[]
                       ((Simd<long,_(unsigned_char)__x02_> *)auStack_40,local_41);
    *plVar2 = lVar3;
  }
  value.v[1] = result.v[0];
  value.v[0] = _auStack_40;
  Push<wabt::interp::Simd<long,(unsigned_char)2>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdShift(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto amount = Pop<u32>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result[i] = f(lhs[i], amount);
  }
  Push(result);
  return RunResult::Ok;
}